

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
fasttext::Model::update(Model *this,vector<int,_std::allocator<int>_> *input,int32_t target,real lr)

{
  loss_name lVar1;
  int *piVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  
  auVar4 = in_ZMM1._0_16_;
  if (target < 0) {
    __assert_fail("target >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/model.cc"
                  ,0xb2,"void fasttext::Model::update(const std::vector<int32_t> &, int32_t, real)")
    ;
  }
  if (target < this->osz_) {
    if ((input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish !=
        (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start) {
      computeHidden(this,input,&this->hidden_);
      lVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->loss;
      if (lVar1 == hs) {
        fVar3 = hierarchicalSoftmax(this,target,lr);
      }
      else if (lVar1 == ns) {
        fVar3 = negativeSampling(this,target,lr);
      }
      else {
        fVar3 = softmax(this,target,lr);
      }
      this->loss_ = fVar3 + this->loss_;
      this->nexamples_ = this->nexamples_ + 1;
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          model == sup) {
        auVar4 = vcvtusi2sd_avx512f(auVar4,(long)(input->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(input->
                                                 super__Vector_base<int,_std::allocator<int>_>).
                                                 _M_impl.super__Vector_impl_data._M_start >> 2);
        Vector::mul(&this->grad_,(float)(1.0 / auVar4._0_8_));
      }
      piVar2 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar2 != (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        do {
          Matrix::addRow((this->wi_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &this->grad_,(long)*piVar2,1.0);
          piVar2 = piVar2 + 1;
        } while (piVar2 != (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish);
      }
    }
    return;
  }
  __assert_fail("target < osz_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/model.cc"
                ,0xb3,"void fasttext::Model::update(const std::vector<int32_t> &, int32_t, real)");
}

Assistant:

void Model::update(const std::vector<int32_t>& input, int32_t target, real lr) {
  assert(target >= 0);
  assert(target < osz_);
  if (input.size() == 0) return;
  computeHidden(input, hidden_);
  if (args_->loss == loss_name::ns) {
    loss_ += negativeSampling(target, lr);
  } else if (args_->loss == loss_name::hs) {
    loss_ += hierarchicalSoftmax(target, lr);
  } else {
    loss_ += softmax(target, lr);
  }
  nexamples_ += 1;

  if (args_->model == model_name::sup) {
    grad_.mul(1.0 / input.size());
  }
  for (auto it = input.cbegin(); it != input.cend(); ++it) {
    wi_->addRow(grad_, *it, 1.0);
  }
}